

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  bool bVar1;
  string *psVar2;
  string *remote_path;
  ostream *poVar3;
  string dir;
  string local_68;
  string local_48;
  
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
  if (!bVar1) {
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
    remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_48,(cmLocalGenerator *)lg,psVar2,remote_path);
    cmSystemTools::ConvertToOutputPath(&local_68,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
    std::__ostream_insert<char,std::char_traits<char>>
              (ruleFileStream,"# Directory level rules for directory ",0x26);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (ruleFileStream,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
    WriteDirectoryRule2(this,ruleFileStream,lg,"all",true,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"clean",false,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"preinstall",true,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // Only subdirectories need these rules.
  if (lg->IsRootMakefile()) {
    return;
  }

  // Begin the directory-level rules section.
  std::string dir =
    cmSystemTools::ConvertToOutputPath(lg->MaybeConvertToRelativePath(
      lg->GetBinaryDirectory(), lg->GetCurrentBinaryDirectory()));
  lg->WriteDivider(ruleFileStream);
  ruleFileStream << "# Directory level rules for directory " << dir << "\n\n";

  // Write directory-level rules for "all".
  this->WriteDirectoryRule2(ruleFileStream, lg, "all", true, false);

  // Write directory-level rules for "clean".
  this->WriteDirectoryRule2(ruleFileStream, lg, "clean", false, false);

  // Write directory-level rules for "preinstall".
  this->WriteDirectoryRule2(ruleFileStream, lg, "preinstall", true, true);
}